

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::WrapNAry
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view prefix,string_view postfix,Precedence precedence)

{
  string_view first_indent;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  size_t sVar1;
  char *pcVar2;
  unsigned_long uVar3;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *pvVar4;
  bool bVar5;
  bool bVar6;
  unsigned_long *puVar7;
  size_type sVar8;
  size_type sVar9;
  reference pvVar10;
  reference pVVar11;
  reference pvVar12;
  char *pcVar13;
  string_view y;
  string_view y_00;
  size_t local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  allocator<char> local_1c9;
  value_type local_1c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  const_iterator local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_190;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  reference local_168;
  Value *child_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range3_1;
  size_t i;
  undefined1 local_138 [7];
  bool ident_with_name;
  undefined1 local_11a;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  iterator local_f8;
  size_type local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  size_t local_d0;
  char *local_c8;
  reference local_c0;
  Value *child_1;
  iterator __end3;
  iterator __begin3;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range3;
  string local_98 [8];
  string s;
  size_t w;
  Value *child;
  iterator __end2;
  iterator __begin2;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range2;
  unsigned_long uStack_48;
  bool multiline;
  size_t max_width;
  size_t total_width;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *pvStack_30;
  Precedence precedence_local;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args_local;
  Decompiler *this_local;
  string_view prefix_local;
  Value *ml;
  
  prefix_local._M_len = (size_t)prefix._M_str;
  this_local = (Decompiler *)prefix._M_len;
  max_width = 0;
  uStack_48 = 0;
  bVar6 = false;
  total_width._4_4_ = precedence;
  pvStack_30 = args;
  args_local = (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)this;
  prefix_local._M_str = (char *)__return_storage_ptr__;
  __end2 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::begin
                     (args);
  child = (Value *)std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                   end(args);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                                     *)&child), sVar1 = max_width, bVar5) {
    pVVar11 = __gnu_cxx::
              __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
              ::operator*(&__end2);
    s.field_2._8_8_ = Value::width(pVVar11);
    puVar7 = std::max<unsigned_long>
                       (&stack0xffffffffffffffb8,(unsigned_long *)(s.field_2._M_local_buf + 8));
    uStack_48 = *puVar7;
    max_width = s.field_2._8_8_ + max_width;
    bVar5 = !bVar6;
    bVar6 = true;
    if (bVar5) {
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pVVar11->v);
      bVar6 = 1 < sVar8;
    }
    __gnu_cxx::
    __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
    ::operator++(&__end2);
  }
  if (!bVar6) {
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size(&postfix);
    if ((sVar1 + sVar8 + sVar9 < this->target_exp_width) ||
       (bVar6 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                empty(pvStack_30), bVar6)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_98,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 (allocator<char> *)((long)&__range3 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      pvVar4 = pvStack_30;
      __end3 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::begin
                         (pvStack_30);
      child_1 = (Value *)std::
                         vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                         end(pvVar4);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                                         *)&child_1), bVar6) {
        pVVar11 = __gnu_cxx::
                  __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                  ::operator*(&__end3);
        local_c0 = pVVar11;
        pvVar10 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                  operator[](pvStack_30,0);
        if (pVVar11 != pvVar10) {
          std::__cxx11::string::operator+=(local_98,", ");
        }
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_c0->v,0);
        std::__cxx11::string::operator+=(local_98,(string *)pvVar12);
        __gnu_cxx::
        __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
        ::operator++(&__end3);
      }
      local_d0 = postfix._M_len;
      local_c8 = postfix._M_str;
      y._M_str = (char *)postfix._M_len;
      y._M_len = (size_t)postfix._M_str;
      operator+=((wabt *)local_98,(string *)postfix._M_len,y);
      std::__cxx11::string::string((string *)&local_118,local_98);
      local_f8 = &local_118;
      local_f0 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_119);
      __l._M_len = local_f0;
      __l._M_array = local_f8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8,__l,&local_119);
      Value::Value(__return_storage_ptr__,&local_e8,total_width._4_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_119);
      local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8;
      do {
        local_230 = local_230 + -1;
        std::__cxx11::string::~string((string *)local_230);
      } while (local_230 != &local_118);
      std::__cxx11::string::~string(local_98);
      return __return_storage_ptr__;
    }
  }
  local_11a = 0;
  memset(local_138,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_138);
  Value::Value(__return_storage_ptr__,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,total_width._4_4_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  uVar3 = uStack_48;
  sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar4 = pvStack_30;
  bVar6 = this->target_exp_width <= uVar3 + sVar8;
  __range3_1 = (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)0x0;
  __end3_1 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::begin
                       (pvStack_30);
  child_2 = (Value *)std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ::end(pvVar4);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
                             *)&child_2), bVar5) {
    pVVar11 = __gnu_cxx::
              __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
              ::operator*(&__end3_1);
    local_168 = pVVar11;
    if (bVar6) {
      local_258 = this->indent_amount;
    }
    else {
      local_258 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    }
    if ((__range3_1 !=
         (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)0x0) ||
       (bVar6)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178);
    }
    else {
      local_178._M_len = (size_t)this_local;
      local_178._M_str = (char *)prefix_local._M_len;
    }
    first_indent._M_str = local_178._M_str;
    first_indent._M_len = local_178._M_len;
    IndentValue(this,pVVar11,local_258,first_indent);
    sVar8 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::size
                      (pvStack_30);
    if (__range3_1 <
        (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)(sVar8 - 1)) {
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::back(&local_168->v);
      std::__cxx11::string::operator+=((string *)pvVar12,",");
    }
    local_180._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_168->v);
    local_188._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_168->v);
    local_190 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             (&__return_storage_ptr__->v);
    local_198 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (local_180,local_188,
                              (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_190);
    __range3_1 = (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 ((long)&(__range3_1->
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<wabt::Decompiler::Value_*,_std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>_>
    ::operator++(&__end3_1);
  }
  if (bVar6) {
    local_1a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&__return_storage_ptr__->v);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1a0,&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_1c8,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_1c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&__return_storage_ptr__->v,local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  sVar1 = postfix._M_len;
  pcVar2 = postfix._M_str;
  pcVar13 = (char *)postfix._M_len;
  pvVar12 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::back(&__return_storage_ptr__->v);
  y_00._M_str = pcVar13;
  y_00._M_len = (size_t)pcVar2;
  operator+=((wabt *)pvVar12,(string *)sVar1,y_00);
  return __return_storage_ptr__;
}

Assistant:

Value WrapNAry(std::vector<Value>& args,
                 std::string_view prefix,
                 std::string_view postfix,
                 Precedence precedence) {
    size_t total_width = 0;
    size_t max_width = 0;
    bool multiline = false;
    for (auto& child : args) {
      auto w = child.width();
      max_width = std::max(max_width, w);
      total_width += w;
      multiline = multiline || child.v.size() > 1;
    }
    if (!multiline &&
        (total_width + prefix.size() + postfix.size() < target_exp_width ||
         args.empty())) {
      // Single line.
      auto s = std::string(prefix);
      for (auto& child : args) {
        if (&child != &args[0])
          s += ", ";
        s += child.v[0];
      }
      s += postfix;
      return Value{{std::move(s)}, precedence};
    } else {
      // Multi-line.
      Value ml{{}, precedence};
      auto ident_with_name = max_width + prefix.size() < target_exp_width;
      size_t i = 0;
      for (auto& child : args) {
        IndentValue(child, ident_with_name ? prefix.size() : indent_amount,
                    !i && ident_with_name ? prefix : std::string_view{});
        if (i < args.size() - 1) {
          child.v.back() += ",";
        }
        std::move(child.v.begin(), child.v.end(), std::back_inserter(ml.v));
        i++;
      }
      if (!ident_with_name) {
        ml.v.insert(ml.v.begin(), std::string(prefix));
      }
      ml.v.back() += postfix;
      return ml;
    }
  }